

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.cpp
# Opt level: O1

void __thiscall MPLSParser::AppInfoPlayList(MPLSParser *this,BitStreamReader *reader)

{
  bool bVar1;
  uint uVar2;
  
  BitStreamReader::skipBits(reader,0x20);
  BitStreamReader::skipBits(reader,8);
  uVar2 = BitStreamReader::getBits(reader,8);
  this->PlayList_playback_type = uVar2;
  if ((uVar2 & 0xfffffffe) == 2) {
    uVar2 = BitStreamReader::getBits(reader,0x10);
    this->playback_count = uVar2;
  }
  else {
    BitStreamReader::skipBits(reader,0x10);
  }
  BitStreamReader::skipBits(reader,0x20);
  BitStreamReader::skipBits(reader,0x20);
  BitStreamReader::skipBits(reader,3);
  bVar1 = BitStreamReader::getBit(reader);
  this->mvc_base_view_r = bVar1;
  BitStreamReader::skipBits(reader,0xc);
  return;
}

Assistant:

void MPLSParser::AppInfoPlayList(BitStreamReader& reader)
{
    reader.skipBits(32);  // length
    reader.skipBits(8);   // reserved_for_future_use
    PlayList_playback_type = reader.getBits<int>(8);
    if (PlayList_playback_type == 2 || PlayList_playback_type == 3)
    {  // 1 == Sequential playback of PlayItems
        playback_count = reader.getBits<int>(16);
    }
    else
    {
        reader.skipBits(16);  // reserved_for_future_use
    }
    UO_mask_table(reader);
    reader.skipBits(3);  // PlayList_random_access_flag, audio_mix_app_flag, lossless_may_bypass_mixer_flag
    mvc_base_view_r = reader.getBit();
    reader.skipBits(12);  // reserved_for_future_use
}